

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcSizeAutoFit(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiContext *pIVar1;
  ImVec2 *in_RSI;
  long in_RDI;
  ImVec2 IVar2;
  ImVec2 size_auto_fit_after_constraint;
  ImVec2 size_min;
  bool is_menu;
  bool is_popup;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 size_auto_fit;
  ImVec2 *in_stack_ffffffffffffff68;
  ImVec2 *in_stack_ffffffffffffff70;
  ImVec2 *rhs;
  ImVec2 *in_stack_ffffffffffffff78;
  ImVec2 *lhs;
  ImVec2 *v;
  ImVec2 in_stack_ffffffffffffff88;
  float local_64;
  float fStack_60;
  undefined1 local_44 [4];
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  float fVar3;
  ImVec2 local_8;
  
  pIVar1 = GImGui;
  if ((*(uint *)(in_RDI + 0xc) & 0x2000000) == 0) {
    if (((*(uint *)(in_RDI + 0xc) & 0x4000000) != 0) ||
       (fVar3 = (GImGui->Style).WindowMinSize.x, (*(uint *)(in_RDI + 0xc) & 0x10000000) != 0)) {
      in_stack_ffffffffffffff88 = (ImVec2)local_44;
      ImVec2::ImVec2((ImVec2 *)in_stack_ffffffffffffff88,4.0,4.0);
      IVar2 = ImMin(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      in_stack_ffffffffffffffc4 = IVar2.x;
      in_stack_ffffffffffffffc8 = IVar2.y;
      fVar3 = in_stack_ffffffffffffffc4;
    }
    rhs = &(pIVar1->IO).DisplaySize;
    lhs = in_RSI;
    operator*(in_stack_ffffffffffffff68,0.0);
    operator-(in_stack_ffffffffffffff68,(ImVec2 *)0x1442e6);
    v = (ImVec2 *)&stack0xffffffffffffffcc;
    ImMax(lhs,rhs);
    local_8 = ImClamp(v,lhs,in_stack_ffffffffffffff88);
    IVar2.y = fVar3;
    IVar2.x = in_stack_ffffffffffffffc8;
    IVar2 = CalcSizeAfterConstraint
                      ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       IVar2);
    local_64 = IVar2.x;
    if (((local_64 < in_RSI->x) && ((*(uint *)(in_RDI + 0xc) & 8) == 0)) &&
       ((*(uint *)(in_RDI + 0xc) & 0x800) != 0)) {
      local_8.y = (pIVar1->Style).ScrollbarSize + local_8.y;
    }
    fStack_60 = IVar2.y;
    if ((fStack_60 < in_RSI->y) && ((*(uint *)(in_RDI + 0xc) & 8) == 0)) {
      local_8.x = (pIVar1->Style).ScrollbarSize + local_8.x;
    }
  }
  else {
    local_8 = *in_RSI;
  }
  return local_8;
}

Assistant:

static ImVec2 CalcSizeAutoFit(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_contents;
    }
    else
    {
        // When the window cannot fit all contents (either because of constraints, either because screen is too small): we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than DisplaySize-WindowPadding.
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));
        ImVec2 size_auto_fit = ImClamp(size_contents, size_min, ImMax(size_min, g.IO.DisplaySize - style.DisplaySafeAreaPadding * 2.0f));
        ImVec2 size_auto_fit_after_constraint = CalcSizeAfterConstraint(window, size_auto_fit);
        if (size_auto_fit_after_constraint.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar))
            size_auto_fit.y += style.ScrollbarSize;
        if (size_auto_fit_after_constraint.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar))
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}